

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O3

void h2o__hostinfo_getaddr_dispatch(h2o_hostinfo_getaddr_req_t *req)

{
  long lVar1;
  long *plVar2;
  st_h2o_linklist_t *psVar3;
  uint uVar4;
  void *__ptr;
  pthread_t tid;
  pthread_t pStack_48;
  pthread_attr_t local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&queue);
  psVar3 = queue.pending.prev;
  if ((req->_pending).next != (st_h2o_linklist_t *)0x0) {
    __assert_fail("!h2o_linklist_is_linked(node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/linklist.h"
                  ,0x59,"void h2o_linklist_insert(h2o_linklist_t *, h2o_linklist_t *)");
  }
  (req->_pending).prev = queue.pending.prev;
  (req->_pending).next = (st_h2o_linklist_t *)0x250d90;
  psVar3->next = &req->_pending;
  ((req->_pending).next)->prev = &req->_pending;
  if ((queue.num_threads_idle == 0) && (queue.num_threads < h2o_hostinfo_max_threads)) {
    pthread_attr_init(&local_40);
    pthread_attr_setdetachstate(&local_40,1);
    pthread_attr_setstacksize(&local_40,0x19000);
    uVar4 = pthread_create(&pStack_48,(pthread_attr_t *)0x0,lookup_thread_main,(void *)0x0);
    if (uVar4 == 0) {
      queue.num_threads = queue.num_threads + 1;
      queue.num_threads_idle = queue.num_threads_idle + 1;
    }
    else {
      if (queue.num_threads == 0) {
        __ptr = (void *)(ulong)uVar4;
        h2o__hostinfo_getaddr_dispatch_cold_1();
        pthread_mutex_lock((pthread_mutex_t *)&queue);
        lVar1 = *(long *)((long)__ptr + 0x18);
        if (lVar1 != 0) {
          plVar2 = *(long **)((long)__ptr + 0x20);
          *(long **)(lVar1 + 8) = plVar2;
          *plVar2 = lVar1;
          *(undefined8 *)((long)__ptr + 0x18) = 0;
          *(undefined8 *)((long)__ptr + 0x20) = 0;
          pthread_mutex_unlock((pthread_mutex_t *)&queue);
          free(__ptr);
          return;
        }
        *(undefined8 *)((long)__ptr + 8) = 0;
        pthread_mutex_unlock((pthread_mutex_t *)&queue);
        return;
      }
      perror("pthread_create(for getaddrinfo)");
    }
  }
  pthread_cond_signal((pthread_cond_t *)&queue.cond);
  pthread_mutex_unlock((pthread_mutex_t *)&queue);
  return;
}

Assistant:

void h2o__hostinfo_getaddr_dispatch(h2o_hostinfo_getaddr_req_t *req)
{
    pthread_mutex_lock(&queue.mutex);

    h2o_linklist_insert(&queue.pending, &req->_pending);

    if (queue.num_threads_idle == 0 && queue.num_threads < h2o_hostinfo_max_threads)
        create_lookup_thread();

    pthread_cond_signal(&queue.cond);
    pthread_mutex_unlock(&queue.mutex);
}